

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

Var Js::ArrayBuffer::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  Var value;
  JavascriptLibrary *this_00;
  ArrayBuffer *pAVar7;
  RecyclableObject *constructor;
  ArrayBuffer *local_90;
  ArrayBuffer *local_78;
  RecyclableObject *newArr;
  undefined1 local_68 [4];
  uint32 byteLength;
  byte local_51;
  Var pvStack_50;
  bool isCtorSuperCall;
  Var newTarget;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  iVar3 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar3);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x181,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  newTarget = RecyclableObject::GetScriptContext(function);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x184,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pvStack_50 = Arguments::GetNewTarget((Arguments *)&scriptContext);
  Arguments::Arguments((Arguments *)local_68,(Arguments *)&scriptContext);
  local_51 = Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)local_68);
  bVar2 = Arguments::IsNewCall((Arguments *)&scriptContext);
  if ((bVar2) &&
     ((pvStack_50 == (Var)0x0 ||
      (BVar4 = Js::JavascriptOperators::IsUndefinedObject(pvStack_50), BVar4 == 0)))) {
    newArr._4_4_ = 0;
    if (((uint)scriptContext & 0xffffff) != 1 && ((ulong)scriptContext & 0xffffff) != 0) {
      value = Arguments::operator[]((Arguments *)&scriptContext,1);
      newArr._4_4_ = ToIndex(value,-0x7ff5ec5b,(ScriptContext *)newTarget,0x7fffffff,true);
    }
    this_00 = ScriptContext::GetLibrary((ScriptContext *)newTarget);
    local_78 = JavascriptLibrary::CreateArrayBuffer(this_00,newArr._4_4_);
    bVar2 = VarIs<Js::ArrayBuffer,Js::RecyclableObject>((RecyclableObject *)local_78);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                  ,0x195,"(VarIs<ArrayBuffer>(newArr))","VarIs<ArrayBuffer>(newArr)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (newArr._4_4_ != 0) {
      pAVar7 = VarTo<Js::ArrayBuffer,Js::RecyclableObject>((RecyclableObject *)local_78);
      iVar3 = (*(pAVar7->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x71])();
      if (iVar3 == 0) {
        JavascriptError::ThrowRangeError((ScriptContext *)newTarget,-0x7ff5ec37,(PCWSTR)0x0);
      }
    }
    bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
    if (bVar2) {
      local_78 = (ArrayBuffer *)Js::JavascriptProxy::AutoProxyWrapper(local_78);
    }
    if ((local_51 & 1) == 0) {
      local_90 = local_78;
    }
    else {
      constructor = VarTo<Js::RecyclableObject>(pvStack_50);
      local_90 = (ArrayBuffer *)
                 Js::JavascriptOperators::OrdinaryCreateFromConstructor
                           (constructor,(RecyclableObject *)local_78,(DynamicObject *)0x0,
                            (ScriptContext *)newTarget);
    }
    return local_90;
  }
  JavascriptError::ThrowTypeError((ScriptContext *)newTarget,-0x7ff5ea00,L"ArrayBuffer");
}

Assistant:

Var ArrayBuffer::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        if (!args.IsNewCall() || (newTarget && JavascriptOperators::IsUndefinedObject(newTarget)))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("ArrayBuffer"));
        }

        uint32 byteLength = 0;
        if (args.Info.Count > 1)
        {
            byteLength = ToIndex(args[1], JSERR_ArrayLengthConstructIncorrect, scriptContext, MaxArrayBufferLength);
        }

        RecyclableObject* newArr = scriptContext->GetLibrary()->CreateArrayBuffer(byteLength);
        Assert(VarIs<ArrayBuffer>(newArr));
        if (byteLength > 0 && !VarTo<ArrayBuffer>(newArr)->GetByteLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_FunctionArgument_Invalid);
        }
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newArr = Js::JavascriptProxy::AutoProxyWrapper(newArr);
        }
#endif
        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), newArr, nullptr, scriptContext) :
            newArr;
    }